

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSModuleDef * js_host_resolve_imported_module(JSContext *ctx,char *base_cname,char *cname1)

{
  char cVar1;
  JSRuntime *pJVar2;
  int iVar3;
  JSAtom v;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  char *__s1;
  list_head *plVar9;
  JSModuleDef *pJVar10;
  undefined1 auVar11 [16];
  JSValue JVar12;
  
  pJVar2 = ctx->rt;
  if (pJVar2->module_normalize_func == (JSModuleNormalizeFunc *)0x0) {
    if (*cname1 == '.') {
      pcVar4 = strrchr(base_cname,0x2f);
      sVar7 = (size_t)((int)pcVar4 - (int)base_cname);
      if (pcVar4 == (char *)0x0) {
        sVar7 = 0;
      }
      sVar5 = strlen(cname1);
      pcVar4 = (char *)js_malloc(ctx,sVar5 + sVar7 + 2);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        memcpy(pcVar4,base_cname,sVar7);
        pcVar4[sVar7] = '\0';
        cVar1 = *cname1;
        while (cVar1 == '.') {
          lVar8 = 2;
          if (cname1[1] != '/') {
            if ((((bool)(~(cVar1 == '.') & 1U | cname1[1] != '.')) || (cname1[2] != '/')) ||
               (*pcVar4 == '\0')) break;
            pcVar6 = strrchr(pcVar4,0x2f);
            __s1 = pcVar6 + 1;
            if (pcVar6 == (char *)0x0) {
              __s1 = pcVar4;
            }
            iVar3 = strcmp(__s1,".");
            if ((iVar3 == 0) || (iVar3 = strcmp(__s1,".."), iVar3 == 0)) break;
            __s1[-(ulong)(pcVar4 < __s1)] = '\0';
            lVar8 = 3;
          }
          cVar1 = cname1[lVar8];
          cname1 = cname1 + lVar8;
        }
        if (*pcVar4 != '\0') {
          sVar7 = strlen(pcVar4);
          (pcVar4 + sVar7)[0] = '/';
          (pcVar4 + sVar7)[1] = '\0';
        }
        strcat(pcVar4,cname1);
      }
    }
    else {
      pcVar4 = js_strdup(ctx,cname1);
    }
  }
  else {
    pcVar4 = (*pJVar2->module_normalize_func)(ctx,base_cname,cname1,pJVar2->module_loader_opaque);
  }
  if (pcVar4 != (char *)0x0) {
    sVar7 = strlen(pcVar4);
    v = JS_NewAtomLen(ctx,pcVar4,sVar7);
    if (v != 0) {
      plVar9 = (ctx->loaded_modules).next;
      do {
        if (plVar9 == &ctx->loaded_modules) {
          pJVar10 = (JSModuleDef *)0x0;
LAB_0012c9ae:
          if (pJVar10 != (JSModuleDef *)0x0) {
            (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar4);
            JS_FreeAtom(ctx,v);
            return pJVar10;
          }
          JS_FreeAtom(ctx,v);
          if (pJVar2->module_loader_func == (JSModuleLoaderFunc *)0x0) {
            JVar12 = JS_ThrowReferenceError(ctx,"could not load module \'%s\'",pcVar4);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = JVar12.tag;
            auVar11 = auVar11 << 0x40;
          }
          else {
            auVar11 = (undefined1  [16])
                      (*pJVar2->module_loader_func)(ctx,pcVar4,pJVar2->module_loader_opaque);
          }
          (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar4);
          return auVar11._0_8_;
        }
        if (*(JSAtom *)((long)&plVar9[-1].next + 4) == v) {
          pJVar10 = (JSModuleDef *)&plVar9[-1].next;
          goto LAB_0012c9ae;
        }
        plVar9 = plVar9->next;
      } while( true );
    }
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar4);
  }
  return (JSModuleDef *)0x0;
}

Assistant:

static JSModuleDef *js_host_resolve_imported_module(JSContext *ctx,
                                                    const char *base_cname,
                                                    const char *cname1)
{
    JSRuntime *rt = ctx->rt;
    JSModuleDef *m;
    char *cname;
    JSAtom module_name;

    if (!rt->module_normalize_func) {
        cname = js_default_module_normalize_name(ctx, base_cname, cname1);
    } else {
        cname = rt->module_normalize_func(ctx, base_cname, cname1,
                                          rt->module_loader_opaque);
    }
    if (!cname)
        return NULL;

    module_name = JS_NewAtom(ctx, cname);
    if (module_name == JS_ATOM_NULL) {
        js_free(ctx, cname);
        return NULL;
    }

    /* first look at the loaded modules */
    m = js_find_loaded_module(ctx, module_name);
    if (m) {
        js_free(ctx, cname);
        JS_FreeAtom(ctx, module_name);
        return m;
    }

    JS_FreeAtom(ctx, module_name);

    /* load the module */
    if (!rt->module_loader_func) {
        /* XXX: use a syntax error ? */
        JS_ThrowReferenceError(ctx, "could not load module '%s'",
                               cname);
        js_free(ctx, cname);
        return NULL;
    }

    m = rt->module_loader_func(ctx, cname, rt->module_loader_opaque);
    js_free(ctx, cname);
    return m;
}